

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding-test.c++
# Opt level: O3

void __thiscall capnp::_::anon_unknown_0::TestCase1325::run(TestCase1325 *this)

{
  short *psVar1;
  Fault f;
  Builder root;
  MallocMessageBuilder builder;
  Builder local_158;
  int local_13c;
  PointerBuilder local_138;
  StructBuilder local_120;
  MallocMessageBuilder local_f8;
  
  MallocMessageBuilder::MallocMessageBuilder(&local_f8,0x400,GROW_HEURISTICALLY);
  MessageBuilder::getRootInternal(&local_158,&local_f8.super_MessageBuilder);
  local_138.pointer = local_158.builder.pointer;
  local_138.segment = local_158.builder.segment;
  local_138.capTable = local_158.builder.capTable;
  PointerBuilder::getStruct(&local_120,&local_138,(StructSize)0x2,(word *)0x0);
  *(short *)local_120.data = 1;
  psVar1 = (short *)((long)local_120.data + 8);
  psVar1[0] = 0x7b;
  psVar1[1] = 0;
  psVar1[2] = 0;
  psVar1[3] = 0;
  MessageBuilder::getRootInternal(&local_158,&local_f8.super_MessageBuilder);
  local_138.pointer = local_158.builder.pointer;
  local_138.segment = local_158.builder.segment;
  local_138.capTable = local_158.builder.capTable;
  PointerBuilder::getStruct(&local_120,&local_138,(StructSize)0x3,(word *)0x0);
  if (*local_120.data == 1) {
    MallocMessageBuilder::~MallocMessageBuilder(&local_f8);
    return;
  }
  local_158.builder.segment = (SegmentBuilder *)0x0;
  local_138.segment = (SegmentBuilder *)0x0;
  local_138.capTable = (CapTableBuilder *)0x0;
  kj::_::Debug::Fault::init
            ((Fault *)&local_158,
             (EVP_PKEY_CTX *)
             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
            );
  if ((*(SegmentBuilder **)((long)local_120.data + 8) != (SegmentBuilder *)0x7b) &&
     (kj::_::Debug::minSeverity < 3)) {
    local_13c = 0x7b;
    local_138.segment = *(SegmentBuilder **)((long)local_120.data + 8);
    kj::_::Debug::log<char_const(&)[40],int,unsigned_long>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x539,ERROR,"\"failed: expected \" \"(123) == (root.getB())\", 123, root.getB()",
               (char (*) [40])"failed: expected (123) == (root.getB())",&local_13c,
               (unsigned_long *)&local_138);
  }
  kj::_::Debug::Fault::fatal((Fault *)&local_158);
}

Assistant:

TEST(Encoding, UpgradeUnion) {
  // This tests for a specific case that was broken originally.
  MallocMessageBuilder builder;

  {
    auto root = builder.getRoot<test::TestOldUnionVersion>();
    root.setB(123);
  }

  {
    auto root = builder.getRoot<test::TestNewUnionVersion>();
    ASSERT_TRUE(root.isB())
    EXPECT_EQ(123, root.getB());
  }
}